

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O1

size_t Potassco::convert_seq<unsigned_int,unsigned_int*>
                 (char *x,size_t maxLen,uint *out,char sep,char **errPos)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  uint temp;
  char *local_58;
  uint local_4c;
  ulong local_48;
  char *local_40;
  char **local_38;
  
  if (x == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    cVar1 = *x;
    local_58 = x;
    if (cVar1 == '[') {
      local_58 = x + 1;
    }
    local_48 = (ulong)(cVar1 == '[');
    sVar4 = 0;
    local_40 = x;
    local_38 = errPos;
    do {
      if (sVar4 == maxLen) break;
      iVar3 = xconvert(local_58,&local_4c,&local_58,(int)sep);
      if (iVar3 == 0) {
LAB_0011847d:
        bVar2 = false;
      }
      else {
        *out = local_4c;
        out = out + 1;
        sVar4 = sVar4 + 1;
        if ((*local_58 != sep || *local_58 == '\0') || (local_58[1] == '\0')) goto LAB_0011847d;
        local_58 = local_58 + 1;
        bVar2 = true;
      }
    } while (bVar2);
    if ((cVar1 != '[') || (*local_58 == ']')) {
      local_40 = local_58 + local_48;
    }
    if (local_38 != (char **)0x0) {
      *local_38 = local_40;
    }
  }
  return sVar4;
}

Assistant:

std::size_t convert_seq(const char* x, std::size_t maxLen, OutIt out, char sep, const char** errPos = 0) {
	if (!x) { return 0; }
	const char* n = x;
	std::size_t t = 0;
	std::size_t b = 0;
	if (*n == '[') { ++b; ++n; }
	while (t != maxLen) {
		T temp;
		if (!xconvert(n, temp, &n, sep)) break;
		*out++ = temp;
		++t;
		if (!*n || *n != (char)sep || !n[1]) break;
		n = n+1;
	}
	if (!b || *n == ']') { n += b; }
	else                 { n  = x; }
	if (errPos) *errPos = n;
	return t;
}